

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyToCorner
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  uint faceid_00;
  int iVar1;
  float *__src;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  byte bVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  int cedgeId [10];
  int cfaceId [10];
  FaceInfo *cface [10];
  uint auStack_168 [12];
  uint auStack_138 [12];
  PtexSeparableKernel local_108;
  FaceInfo *apFStack_88 [11];
  FaceInfo *f_00;
  
  bVar3 = f->flags >> 3;
  iVar8 = 0;
  lVar6 = -1;
  f_00 = f;
  uVar10 = faceid;
  uVar9 = eid;
  do {
    faceid_00 = f_00->adjfaces[(int)uVar9];
    uVar12 = (uint)(f_00->adjedges >> ((char)uVar9 * '\x02' & 0x1fU));
    uVar9 = uVar12 + 1 & 3;
    if (((int)faceid_00 < 0) || ((faceid_00 == faceid && (uVar9 == eid)))) {
      iVar8 = (int)lVar6 + -1;
      iVar4 = 2;
      bVar2 = false;
      bVar5 = bVar3;
    }
    else {
      iVar4 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,(ulong)faceid_00);
      f_00 = (FaceInfo *)CONCAT44(extraout_var,iVar4);
      auStack_138[lVar6 + 1] = faceid_00;
      auStack_168[lVar6 + 1] = uVar9;
      apFStack_88[lVar6 + 1] = f_00;
      bVar7 = f_00->flags & 8;
      bVar5 = bVar7 >> 3;
      iVar4 = 0;
      bVar2 = true;
      if (((bVar7 == 0) && ((bVar3 & 1) != 0)) && (f_00->adjfaces[uVar12 & 3] == uVar10)) {
        PtexSeparableKernel::adjustSubfaceToMain(k,eid + (uint)(lVar6 == 0) * 2);
        PtexSeparableKernel::rotate(k,((eid + 3) - (uint)(lVar6 == 0)) - uVar9);
        splitAndApply(this,k,faceid_00,f_00);
        iVar4 = 1;
        bVar2 = false;
        bVar5 = bVar3;
      }
    }
    bVar3 = bVar5;
    if (!bVar2) goto LAB_001184ad;
    lVar6 = lVar6 + 1;
    uVar10 = faceid_00;
  } while (lVar6 != 9);
  iVar4 = 2;
LAB_001184ad:
  if (iVar4 == 2) {
    if (iVar8 == 1) {
      applyToCornerFace(this,k,f,eid,auStack_138[1],apFStack_88[1],auStack_168[1]);
    }
    else if (iVar8 < 2) {
      fVar13 = PtexSeparableKernel::weight(k);
      this->_weight = this->_weight - fVar13;
    }
    else {
      PtexSeparableKernel::rotate(k,eid + 2);
      fVar13 = PtexSeparableKernel::weight(k);
      fVar14 = PtexSeparableKernel::makeSymmetric(k,fVar13);
      uVar11 = 1;
      do {
        local_108.res = k->res;
        __src = k->kv;
        iVar4 = k->rot;
        local_108.u = k->u;
        local_108.v = k->v;
        local_108.uw = k->uw;
        local_108.vw = k->vw;
        iVar1 = k->vw;
        memcpy(local_108.kubuff,k->ku,(long)k->uw << 2);
        memcpy(local_108.kvbuff,__src,(long)iVar1 << 2);
        local_108.ku = local_108.kubuff;
        local_108.kv = local_108.kvbuff;
        local_108.rot = iVar4;
        applyToCornerFace(this,&local_108,f,2,auStack_138[uVar11],apFStack_88[uVar11],
                          auStack_168[uVar11]);
        uVar11 = uVar11 + 1;
      } while (iVar8 + 1 != uVar11);
      this->_weight = (fVar14 * (float)iVar8 - fVar13) + this->_weight;
    }
  }
  return;
}

Assistant:

void PtexSeparableFilter::applyToCorner(PtexSeparableKernel& k, int faceid,
                                        const Ptex::FaceInfo& f, int eid)
{
    // traverse clockwise around corner vertex and gather corner faces
    int afid = faceid, aeid = eid;
    const FaceInfo* af = &f;
    bool prevIsSubface = af->isSubface();

    const int MaxValence = 10;
    int cfaceId[MaxValence];
    int cedgeId[MaxValence];
    const FaceInfo* cface[MaxValence];

    int numCorners = 0;
    for (int i = 0; i < MaxValence; i++) {
        // advance to next face
        int prevFace = afid;
        afid = af->adjface(aeid);
        aeid = (af->adjedge(aeid) + 1) % 4;

        // we hit a boundary or reached starting face
        // note: we need to check edge id too because we might have
        // a periodic texture (w/ toroidal topology) where all 4 corners
        // are from the same face
        if (afid < 0 || (afid == faceid && aeid == eid)) {
            numCorners = i - 2;
            break;
        }

        // record face info
        af = &_tx->getFaceInfo(afid);
        cfaceId[i] = afid;
        cedgeId[i] = aeid;
        cface[i] = af;

        // check to see if corner is a subface "tee"
        bool isSubface = af->isSubface();
        if (prevIsSubface && !isSubface && af->adjface((aeid+3)%4) == prevFace)
        {
            // adjust the eid depending on whether we started from
            // the primary or secondary subface.
            bool primary = (i==1);
            k.adjustSubfaceToMain(eid + primary * 2);
            k.rotate(eid - aeid + 3 - primary);
            splitAndApply(k, afid, *af);
            return;
        }
        prevIsSubface = isSubface;
    }

    if (numCorners == 1) {
        // regular case (valence 4)
        applyToCornerFace(k, f, eid, cfaceId[1], *cface[1], cedgeId[1]);
    }
    else if (numCorners > 1) {
        // valence 5+, make kernel symmetric and apply equally to each face
        // first, rotate to standard orientation, u=v=0
        k.rotate(eid + 2);
        float initialWeight = k.weight();
        float newWeight = k.makeSymmetric(initialWeight);
        for (int i = 1; i <= numCorners; i++) {
            PtexSeparableKernel kc = k;
            applyToCornerFace(kc, f, 2, cfaceId[i], *cface[i], cedgeId[i]);
        }
        // adjust weight for symmetrification and for additional corners
        _weight += newWeight * (float)numCorners - initialWeight;
    }
    else {
        // valence 2 or 3, ignore corner face (just adjust weight)
        _weight -= k.weight();
    }
}